

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void mi_arenas_try_purge(_Bool force,_Bool visit_all)

{
  bool bVar1;
  size_t sVar2;
  int64_t iVar3;
  byte bVar4;
  _Bool _Var5;
  long lVar6;
  mi_msecs_t mVar7;
  mi_atomic_guard_t mVar8;
  long lVar9;
  byte bVar10;
  byte in_SIL;
  byte in_DIL;
  bool bVar11;
  mi_arena_t *arena;
  size_t i;
  _Bool all_visited;
  size_t max_purge_count;
  _Bool _mi_guard_once;
  uintptr_t _mi_guard_expected;
  size_t max_arena;
  mi_msecs_t arenas_expire;
  mi_msecs_t now;
  size_t local_b8;
  ulong local_70;
  size_t local_60;
  mi_atomic_guard_t local_38;
  undefined6 in_stack_fffffffffffffff8;
  
  bVar10 = in_DIL & 1;
  bVar4 = in_SIL & 1;
  _Var5 = _mi_preloading();
  if ((((!_Var5) && (lVar6 = mi_arena_purge_delay(), 0 < lVar6)) &&
      ((mVar7 = _mi_clock_now(), iVar3 = mi_arenas_purge_expire, sVar2 = mi_arena_count,
       (bVar10 & 1) != 0 || ((mi_arenas_purge_expire != 0 && (mVar7 <= mi_arenas_purge_expire))))))
     && (mi_arena_count != 0)) {
    local_38 = 0;
    bVar1 = true;
    while( true ) {
      bVar11 = false;
      if (bVar1) {
        LOCK();
        bVar11 = local_38 == mi_arenas_try_purge::purge_guard;
        mVar8 = mi_arenas_try_purge::purge_guard;
        if (bVar11) {
          mi_arenas_try_purge::purge_guard = 1;
          mVar8 = local_38;
        }
        UNLOCK();
        if (!bVar11) {
          local_38 = mVar8;
        }
      }
      if (!bVar11) break;
      lVar6 = mVar7;
      lVar9 = mi_arena_purge_delay();
      mi_arenas_purge_expire = mVar7 + lVar9;
      if ((bVar4 & 1) == 0) {
        local_b8 = 2;
      }
      else {
        local_b8 = sVar2;
      }
      local_60 = local_b8;
      bVar1 = true;
      for (local_70 = 0; local_70 < sVar2; local_70 = local_70 + 1) {
        if ((mi_arenas[local_70] != (mi_arena_t *)0x0) &&
           (_Var5 = mi_arena_try_purge((mi_arena_t *)
                                       CONCAT17(bVar10,CONCAT16(bVar4,in_stack_fffffffffffffff8)),
                                       lVar6,SUB81((ulong)iVar3 >> 0x38,0)), _Var5)) {
          if (local_60 < 2) {
            bVar1 = false;
            break;
          }
          local_60 = local_60 - 1;
        }
      }
      if (bVar1) {
        mi_arenas_purge_expire = 0;
      }
      mi_arenas_try_purge::purge_guard = 0;
      bVar1 = false;
      mVar7 = lVar6;
    }
  }
  return;
}

Assistant:

static void mi_arenas_try_purge( bool force, bool visit_all ) 
{
  if (_mi_preloading() || mi_arena_purge_delay() <= 0) return;  // nothing will be scheduled

  // check if any arena needs purging?
  const mi_msecs_t now = _mi_clock_now();
  mi_msecs_t arenas_expire = mi_atomic_loadi64_acquire(&mi_arenas_purge_expire);
  if (!force && (arenas_expire == 0 || arenas_expire < now)) return;

  const size_t max_arena = mi_atomic_load_acquire(&mi_arena_count);
  if (max_arena == 0) return;

  // allow only one thread to purge at a time
  static mi_atomic_guard_t purge_guard;
  mi_atomic_guard(&purge_guard)
  {
    // increase global expire: at most one purge per delay cycle
    mi_atomic_storei64_release(&mi_arenas_purge_expire, now + mi_arena_purge_delay());  
    size_t max_purge_count = (visit_all ? max_arena : 2);
    bool all_visited = true;
    for (size_t i = 0; i < max_arena; i++) {
      mi_arena_t* arena = mi_atomic_load_ptr_acquire(mi_arena_t, &mi_arenas[i]);
      if (arena != NULL) {
        if (mi_arena_try_purge(arena, now, force)) {
          if (max_purge_count <= 1) {
            all_visited = false;
            break;
          }
          max_purge_count--;
        }
      }
    }
    if (all_visited) {
      // all arena's were visited and purged: reset global expire
      mi_atomic_storei64_release(&mi_arenas_purge_expire, 0);
    }
  }
}